

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_poscall(lua_State *L,CallInfo *ci,int nres)

{
  l_uint32 *plVar1;
  CallInfo *ci_00;
  StkId pSVar2;
  lu_byte lVar3;
  uint uVar4;
  uint uVar5;
  StkId level;
  ulong uVar6;
  long lVar7;
  lu_byte *plVar8;
  long lVar9;
  long lVar10;
  TValue *io1;
  
  uVar5 = ci->callstatus;
  if ((L->hookmask != 0) && ((uVar5 >> 0x12 & 1) == 0)) {
    rethook(L,ci,nres);
  }
  level = (ci->func).p;
  uVar4 = uVar5 & 0x400ff;
  if (uVar4 == 0) {
    lVar9 = (long)nres;
    lVar7 = lVar9 * 0x10;
    if (nres < 1) {
      uVar6 = 0;
    }
    else {
      pSVar2 = (L->top).p;
      lVar10 = 8;
      uVar6 = 0;
      do {
        *(undefined8 *)((long)level + lVar10 + -8) =
             *(undefined8 *)((long)pSVar2 + lVar10 + lVar9 * -0x10 + -8);
        *(undefined1 *)((long)level + lVar10) =
             *(undefined1 *)((long)pSVar2 + lVar10 + lVar9 * -0x10);
        uVar6 = uVar6 + 1;
        lVar10 = lVar10 + 0x10;
      } while ((uint)nres != uVar6);
    }
    if ((int)uVar6 < nres) {
      lVar9 = (ulong)(uint)nres - (uVar6 & 0xffffffff);
      plVar8 = &(&level->val)[uVar6 & 0xffffffff].tt_;
      do {
        *plVar8 = '\0';
        plVar8 = plVar8 + 0x10;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
  }
  else {
    if (uVar4 == 2) {
      if (nres == 0) {
        lVar3 = '\0';
      }
      else {
        pSVar2 = (L->top).p;
        (level->val).value_ = pSVar2[-(long)nres].val.value_;
        lVar3 = *(lu_byte *)((long)pSVar2 + (long)nres * -0x10 + 8);
      }
      (level->val).tt_ = lVar3;
      level = level + 1;
      goto LAB_0010b8ea;
    }
    if (uVar4 == 1) goto LAB_0010b8ea;
    uVar4 = (uVar5 & 0xff) - 1;
    if ((uVar5 >> 0x12 & 1) != 0) {
      (L->ci->u2).funcidx = nres;
      plVar1 = &L->ci->callstatus;
      *plVar1 = *plVar1 | 0x20000;
      level = luaF_close(L,level,'\x06',1);
      ci_00 = L->ci;
      plVar1 = &ci_00->callstatus;
      *plVar1 = *plVar1 & 0xfffdffff;
      if (L->hookmask != 0) {
        lVar9 = (L->stack).offset;
        rethook(L,ci_00,nres);
        level = (StkId)(((long)level - lVar9) + (long)(L->stack).p);
      }
      if ((uVar5 & 0xff) == 0) {
        uVar4 = nres;
      }
    }
    uVar5 = uVar4;
    if (nres < (int)uVar4) {
      uVar5 = nres;
    }
    if ((int)uVar5 < 1) {
      uVar6 = 0;
    }
    else {
      pSVar2 = (L->top).p;
      lVar9 = 8;
      uVar6 = 0;
      do {
        *(undefined8 *)((long)level + lVar9 + -8) =
             *(undefined8 *)((long)pSVar2 + lVar9 + (long)nres * -0x10 + -8);
        *(undefined1 *)((long)level + lVar9) =
             *(undefined1 *)((long)pSVar2 + lVar9 + (long)nres * -0x10);
        uVar6 = uVar6 + 1;
        lVar9 = lVar9 + 0x10;
      } while (uVar5 != uVar6);
    }
    if ((int)uVar6 < (int)uVar4) {
      lVar9 = (ulong)uVar4 - (uVar6 & 0xffffffff);
      plVar8 = &(&level->val)[uVar6 & 0xffffffff].tt_;
      do {
        *plVar8 = '\0';
        plVar8 = plVar8 + 0x10;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    lVar7 = (long)(int)uVar4 << 4;
  }
  level = (StkId)((long)level + lVar7);
LAB_0010b8ea:
  (L->top).p = level;
  L->ci = ci->previous;
  return;
}

Assistant:

void luaD_poscall (lua_State *L, CallInfo *ci, int nres) {
  l_uint32 fwanted = ci->callstatus & (CIST_TBC | CIST_NRESULTS);
  if (l_unlikely(L->hookmask) && !(fwanted & CIST_TBC))
    rethook(L, ci, nres);
  /* move results to proper place */
  moveresults(L, ci->func.p, nres, fwanted);
  /* function cannot be in any of these cases when returning */
  lua_assert(!(ci->callstatus &
        (CIST_HOOKED | CIST_YPCALL | CIST_FIN | CIST_CLSRET)));
  L->ci = ci->previous;  /* back to caller (after closing variables) */
}